

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

int Abc_NtkDarPrintCone(Abc_Ntk_t *pNtk)

{
  Aig_Man_t *p;
  int iVar1;
  
  p = Abc_NtkToDar(pNtk,0,1);
  iVar1 = 0;
  if (p != (Aig_Man_t *)0x0) {
    if (p->nRegs < 1) {
      __assert_fail("Aig_ManRegNum(pMan) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDar.c"
                    ,0xfb0,"int Abc_NtkDarPrintCone(Abc_Ntk_t *)");
    }
    Saig_ManPrintCones(p);
    Aig_ManStop(p);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_NtkDarPrintCone( Abc_Ntk_t * pNtk )
{
    extern void Saig_ManPrintCones( Aig_Man_t * pAig );
    Aig_Man_t * pMan;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return 0;
    assert( Aig_ManRegNum(pMan) > 0 );
    Saig_ManPrintCones( pMan );
    Aig_ManStop( pMan );
    return 1;
}